

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::detail::Type_Conversion_Base>
chaiscript::
make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::runtime_error,chaiscript::exception::arithmetic_error>>
          (void)

{
  Type_Conversion_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  
  __p = (Type_Conversion_Base *)operator_new(0x38);
  detail::Dynamic_Conversion_Impl<std::runtime_error,_chaiscript::exception::arithmetic_error>::
  Dynamic_Conversion_Impl
            ((Dynamic_Conversion_Impl<std::runtime_error,_chaiscript::exception::arithmetic_error> *
             )__p);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::
  shared_ptr<chaiscript::detail::Type_Conversion_Base,void>
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)in_RDI,__p);
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }